

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

HighsInt __thiscall presolve::HPresolve::findNonzero(HPresolve *this,HighsInt row,HighsInt col)

{
  HighsInt HVar1;
  reference pvVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  anon_class_8_1_8991fb9c *in_stack_00000008;
  anon_class_8_1_8991fb9c *in_stack_00000010;
  anon_class_8_1_8991fb9c get_row_key;
  anon_class_8_1_8991fb9c get_row_right;
  anon_class_8_1_8991fb9c get_row_left;
  undefined4 local_4;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb8),(long)in_ESI);
  if (*pvVar2 == -1) {
    local_4 = -1;
  }
  else {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb8),(long)in_ESI);
    HVar1 = highs_splay<int,presolve::HPresolve::findNonzero(int,int)::__0&,presolve::HPresolve::findNonzero(int,int)::__1&,presolve::HPresolve::findNonzero(int,int)::__2&>
                      ((int *)get_row_left.this,get_row_right.this._4_4_,
                       (anon_class_8_1_8991fb9c *)get_row_key.this,in_stack_00000010,
                       in_stack_00000008);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb8),(long)in_ESI);
    *pvVar2 = HVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb8),(long)in_ESI);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)*pvVar2);
    if (*pvVar2 == in_EDX) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb8),(long)in_ESI);
      local_4 = *pvVar2;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

HighsInt HPresolve::findNonzero(HighsInt row, HighsInt col) {
  if (rowroot[row] == -1) return -1;

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  rowroot[row] =
      highs_splay(col, rowroot[row], get_row_left, get_row_right, get_row_key);

  if (Acol[rowroot[row]] == col) return rowroot[row];

  return -1;
}